

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprintconv.cpp
# Opt level: O1

void doit(void)

{
  size_type __n;
  FILE *__stream;
  FILE *__stream_00;
  FILE *__s;
  size_t sVar1;
  undefined8 extraout_RAX;
  long lVar2;
  int iVar3;
  uint uVar4;
  uLongf len;
  vector<EventRow,_std::allocator<EventRow>_> rv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rvz;
  EventIndex out_idx;
  EventIndex in_idx;
  int hasIntensityUncertainty;
  int intensity_bins;
  size_t local_b0;
  vector<EventRow,_std::allocator<EventRow>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  FILE *local_70;
  FILE *local_68;
  undefined4 local_60;
  long local_5c;
  size_t local_54;
  undefined4 local_4c;
  long local_48;
  size_type local_40;
  uint local_38;
  uint local_34;
  
  __stream = fopen("footprint.bin","rb");
  __stream_00 = fopen("footprint.idx","rb");
  if (__stream == (FILE *)0x0) {
    doit();
  }
  else if (__stream_00 != (FILE *)0x0) {
    __s = fopen("footprint.bin.z","wb");
    local_70 = fopen("footprint.idx.z","wb");
    iVar3 = 0;
    local_34 = 0;
    local_38 = 0;
    fread(&local_34,4,1,__stream);
    fread(&local_38,4,1,__stream);
    fprintf(_stderr,"intensity_bins: %d hasIntensityUncertainty: %d\n",(ulong)local_34,
            (ulong)local_38);
    fwrite(&local_34,4,1,__s);
    local_68 = __s;
    fwrite(&local_38,4,1,__s);
    sVar1 = fread(&local_4c,0x14,1,__stream_00);
    local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5c = 8;
    if (sVar1 == 0) {
      uVar4 = 8;
      lVar2 = 8;
    }
    else {
      lVar2 = 0;
      do {
        fseek(__stream,local_48,0);
        __n = local_40;
        std::vector<EventRow,_std::allocator<EventRow>_>::resize(&local_a8,local_40);
        fread(local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
              super__Vector_impl_data._M_start,4,__n,__stream);
        if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (long)local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                   (0x400 - (long)local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
        local_b0 = (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
        compress(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_b0,
                 local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
                 super__Vector_impl_data._M_start,__n);
        sVar1 = local_b0;
        fwrite(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,local_b0,1,local_68);
        local_60 = local_4c;
        local_54 = local_b0;
        fwrite(&local_60,0x14,1,local_70);
        local_5c = local_5c + local_b0;
        if (local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        lVar2 = lVar2 + __n;
        iVar3 = iVar3 + (int)sVar1;
        sVar1 = fread(&local_4c,0x14,1,__stream_00);
      } while (sVar1 != 0);
      lVar2 = lVar2 + 8;
      uVar4 = iVar3 + 8;
    }
    printf("TODO: expected input size  %zd\n",lVar2);
    printf("TODO: expected output size  %d\n",(ulong)uVar4);
    fclose(local_68);
    fclose(local_70);
    fclose(__stream);
    fclose(__stream_00);
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  doit();
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void doit()
{
    FILE *finx = fopen("footprint.bin", "rb");
	FILE *finy = fopen("footprint.idx", "rb");
    if (finx == NULL) {
        fprintf(stderr,"File not found footprint.bin\n");
        exit(-1);
    }
    if (finy == NULL) {
        fprintf(stderr,"File not found footprint.idx\n");
        exit(-1);
    }


    FILE *foutx = fopen("footprint.bin.z", "wb");
    FILE *fouty = fopen("footprint.idx.z", "wb");
    int intensity_bins = 0;
    int hasIntensityUncertainty =0;
    fread(&intensity_bins, sizeof(intensity_bins), 1, finx);
    fread(&hasIntensityUncertainty, sizeof(hasIntensityUncertainty), 1, finx);
    fprintf(stderr,"intensity_bins: %d hasIntensityUncertainty: %d\n",intensity_bins,hasIntensityUncertainty);
    fwrite(&intensity_bins, sizeof(intensity_bins), 1, foutx);
    fwrite(&hasIntensityUncertainty, sizeof(hasIntensityUncertainty), 1, foutx);

    EventIndex in_idx;
    EventIndex out_idx;
    size_t i = fread(&in_idx, sizeof(in_idx), 1, finy);
    std::vector<EventRow> rv;
    std::vector<unsigned char> rvz;
    size_t total_insize = 0;
    int total_outsize = 0;
    out_idx.offset = 8;
    while (i != 0) {
		flseek(finx, in_idx.offset, SEEK_SET);                
        rv.resize(in_idx.size);
        total_insize += in_idx.size;
        fread(&rv[0], sizeof(1), in_idx.size,finx);
        rvz.clear();
        rvz.resize(rv.size() * sizeof(EventRow) + 1024);
        uLongf len = (uLongf)rvz.size();
        compress(&rvz[0], &len, (unsigned char *)&rv[0], in_idx.size);
        total_outsize += len;
        fwrite((unsigned char *)&rvz[0], len, 1, foutx);
        out_idx.event_id = in_idx.event_id;        
        out_idx.size = len;
        fwrite(&out_idx, sizeof(out_idx), 1, fouty);
        // fprintf(stderr,"%d, %ld, %d\n", in_idx.event_id, in_idx.offset, in_idx.size);
        // fprintf(stderr,"%d, %ld, %d\n", out_idx.event_id, out_idx.offset, out_idx.size);
    /*  
        long long j=0;  
	    while (j < in_idx.size) {
            EventRow row;
            fread(&row, sizeof(row), 1,finx);
            // printf("%d, %d, %d, %.10e\n", in_idx.event_id,row.areaperil_id,row.intensity_bin_id, row.probability);

            j += sizeof(row);
	    }
*/
        out_idx.offset += len;;                
        rv.clear();
        i = fread(&in_idx, sizeof(in_idx), 1, finy);
    }

    printf("TODO: expected input size  %zd\n",total_insize+8);
    printf("TODO: expected output size  %d\n",total_outsize+8);
    fclose(foutx);
    fclose(fouty);
    fclose(finx);
    fclose(finy);
}